

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::setUUIDFunction(Server *this,uuid_func func)

{
  _List_node_base *p_Var1;
  string_view uuid;
  string local_48;
  
  this->m_calc_uuid = func;
  p_Var1 = (_List_node_base *)&this->players;
  while (p_Var1 = (((_List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->players) {
    (*this->m_calc_uuid)(&local_48,(PlayerInfo *)(p_Var1 + 1));
    uuid._M_str = local_48._M_dataplus._M_p;
    uuid._M_len = local_48._M_string_length;
    setUUIDIfDifferent(this,(PlayerInfo *)(p_Var1 + 1),uuid);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void RenX::Server::setUUIDFunction(RenX::Server::uuid_func func) {
	m_calc_uuid = func;

	for (auto node = this->players.begin(); node != this->players.end(); ++node) {
		setUUIDIfDifferent(*node, m_calc_uuid(*node));
	}
}